

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::return_statement::~return_statement(return_statement *this)

{
  ~return_statement(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit return_statement(const source_extend& extend, expression_ptr&& e) : statement(extend), e_(std::move(e)) {}